

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

size_t Catch::listTags(Config *config)

{
  char *pcVar1;
  pointer pbVar2;
  size_t sVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestSpecParser *this;
  IRegistryHub *pIVar5;
  undefined4 extraout_var_01;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  iterator iVar6;
  _Rb_tree_node_base *p_Var7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_bool>
  pVar11;
  string tagName;
  string lcaseTagName;
  Text wrapper;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  tagCounts;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  TestSpec testSpec;
  ostringstream oss;
  string local_330;
  undefined1 local_310 [32];
  undefined1 local_2f0 [48];
  _Link_type local_2c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  local_298;
  pointer local_268;
  pointer local_260;
  _Rb_tree_node_base *local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_230;
  TestSpec local_218;
  undefined1 *local_200;
  size_type local_1f8;
  undefined1 local_1f0 [16];
  TagInfo local_1e0;
  undefined1 local_1a8 [8];
  _Alloc_hider local_1a0;
  char local_198 [8];
  undefined1 local_190 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
  local_170;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> vStack_158;
  TagAliasRegistry *local_140;
  
  iVar4 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            (&local_218.m_filters,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar4));
  iVar4 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])(config);
  if (*(long *)CONCAT44(extraout_var_00,iVar4) == ((long *)CONCAT44(extraout_var_00,iVar4))[1]) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"All available tags:\n",0x14);
    TagAliasRegistry::get();
    local_190._8_8_ = 0;
    local_180._M_local_buf[0] = '\0';
    local_170.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_170.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_170.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_158.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_158.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_158.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_140 = &TagAliasRegistry::get::instance;
    local_2f0._0_8_ = local_2f0 + 0x10;
    local_190._0_8_ = &local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"*","");
    this = TestSpecParser::parse((TestSpecParser *)local_1a8,(string *)local_2f0);
    TestSpecParser::addFilter(this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               &local_298,&(this->m_testSpec).m_filters);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::operator=
              (&local_218.m_filters,
               (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               &local_298);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               &local_298);
    if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
      operator_delete((void *)local_2f0._0_8_);
    }
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&vStack_158);
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::~vector(&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._0_8_ != &local_180) {
      operator_delete((void *)local_190._0_8_);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Tags for matching test cases:\n",0x1e);
  }
  local_298._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_298._M_impl.super__Rb_tree_header._M_header;
  local_298._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_298._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_298._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_298._M_impl.super__Rb_tree_header._M_header._M_right =
       local_298._M_impl.super__Rb_tree_header._M_header._M_left;
  pIVar5 = getRegistryHub();
  iVar4 = (*pIVar5->_vptr_IRegistryHub[3])(pIVar5);
  testCases = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x18))
                        ((long *)CONCAT44(extraout_var_01,iVar4),config);
  filterTests(&local_230,testCases,&local_218,(IConfig *)config);
  local_268 = local_230.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (local_230.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_230.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      p_Var7 = ((local_230.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                 _M_impl.super__Vector_impl_data._M_start)->super_TestCaseInfo).tags._M_t._M_impl.
               super__Rb_tree_header._M_header._M_left;
      local_258 = &((local_230.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>
                     ._M_impl.super__Vector_impl_data._M_start)->super_TestCaseInfo).tags._M_t.
                   _M_impl.super__Rb_tree_header._M_header;
      local_260 = local_230.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      if (p_Var7 != local_258) {
        do {
          local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_330,*(long *)(p_Var7 + 1),
                     (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
          toLower((string *)local_310,&local_330);
          iVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                  ::find(&local_298,(string *)local_310);
          if ((_Rb_tree_header *)iVar6._M_node == &local_298._M_impl.super__Rb_tree_header) {
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_250,local_310._0_8_,
                       (pointer)(local_310._0_8_ + local_310._8_8_));
            local_1e0.spellings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_1e0.spellings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            local_1e0.spellings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_1e0.spellings._M_t._M_impl.super__Rb_tree_header._M_header;
            local_1e0.spellings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_1e0.count = 0;
            local_1e0.spellings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_1e0.spellings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
            ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                    *)local_2f0,&local_250,&local_1e0);
            std::pair<std::__cxx11::string_const,Catch::TagInfo>::
            pair<std::__cxx11::string,Catch::TagInfo>
                      ((pair<std::__cxx11::string_const,Catch::TagInfo> *)local_1a8,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                        *)local_2f0);
            pVar11 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                     ::_M_insert_unique(&local_298,(value_type *)local_1a8);
            iVar6._M_node = (_Base_ptr)pVar11.first._M_node;
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(local_190 + 8),(_Link_type)local_180._8_8_);
            if (local_1a8 != (undefined1  [8])local_198) {
              operator_delete((void *)local_1a8);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(local_2f0 + 0x20),local_2c0);
            if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
              operator_delete((void *)local_2f0._0_8_);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_1e0,
                       (_Link_type)
                       local_1e0.spellings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p);
            }
          }
          iVar6._M_node[3]._M_left = (_Base_ptr)((long)&(iVar6._M_node[3]._M_left)->_M_color + 1);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_insert_unique((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(iVar6._M_node + 2),&local_330);
          if ((undefined1 *)local_310._0_8_ != local_310 + 0x10) {
            operator_delete((void *)local_310._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_dataplus._M_p != &local_330.field_2) {
            operator_delete(local_330._M_dataplus._M_p);
          }
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
        } while (p_Var7 != local_258);
      }
      local_230.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_start = local_260 + 1;
    } while (local_230.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl
             .super__Vector_impl_data._M_start != local_268);
  }
  if ((_Rb_tree_header *)local_298._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_298._M_impl.super__Rb_tree_header) {
    p_Var9 = local_298._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      pcVar1 = local_198 + *(long *)((long)local_1a8 + -0x18);
      pcVar1[0] = '\x02';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  ",2);
      TagInfo::all_abi_cxx11_(&local_330,(TagInfo *)(p_Var9 + 2));
      local_310._16_8_ = 0x4f;
      local_310[0x18] = '\t';
      local_310._0_8_ = (pointer)0x0;
      local_310._8_8_ = 0;
      std::__cxx11::stringbuf::str();
      local_310._8_8_ = local_1f8;
      local_310._16_8_ = 0x46;
      Tbc::Text::Text((Text *)local_2f0,&local_330,(TextAttributes *)local_310);
      if (local_200 != local_1f0) {
        operator_delete(local_200);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p);
      }
      std::__cxx11::stringbuf::str();
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_330._M_dataplus._M_p,
                          local_330._M_string_length);
      pbVar2 = local_2b0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (p_Var10 = (_Base_ptr)
                     local_2b0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; p_Var10 != (_Base_ptr)pbVar2;
          p_Var10 = p_Var10 + 1) {
        if (p_Var10 !=
            (_Base_ptr)
            local_2b0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,*(char **)p_Var10,(long)p_Var10->_M_parent);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2b0);
      if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
        operator_delete((void *)local_2f0._0_8_);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != &local_298._M_impl.super__Rb_tree_header);
  }
  sVar3 = local_298._M_impl.super__Rb_tree_header._M_node_count;
  local_2f0._0_8_ = local_2f0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"tag","");
  local_1a8 = (undefined1  [8])sVar3;
  local_1a0._M_p = local_190;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,local_2f0._0_8_,(pointer)(local_2f0._0_8_ + local_2f0._8_8_));
  operator<<((ostream *)&std::cout,(pluralise *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  if (local_1a0._M_p != local_190) {
    operator_delete(local_1a0._M_p);
  }
  if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
    operator_delete((void *)local_2f0._0_8_);
  }
  sVar3 = local_298._M_impl.super__Rb_tree_header._M_node_count;
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&local_230);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  ::_M_erase(&local_298,(_Link_type)local_298._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&local_218.m_filters);
  return (size_t)(pointer)sVar3;
}

Assistant:

inline std::size_t listTags( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        if( config.testSpec().hasFilters() )
            Catch::cout() << "Tags for matching test cases:\n";
        else {
            Catch::cout() << "All available tags:\n";
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        }

        std::map<std::string, TagInfo> tagCounts;

        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            for( std::set<std::string>::const_iterator  tagIt = it->getTestCaseInfo().tags.begin(),
                                                        tagItEnd = it->getTestCaseInfo().tags.end();
                    tagIt != tagItEnd;
                    ++tagIt ) {
                std::string tagName = *tagIt;
                std::string lcaseTagName = toLower( tagName );
                std::map<std::string, TagInfo>::iterator countIt = tagCounts.find( lcaseTagName );
                if( countIt == tagCounts.end() )
                    countIt = tagCounts.insert( std::make_pair( lcaseTagName, TagInfo() ) ).first;
                countIt->second.add( tagName );
            }
        }

        for( std::map<std::string, TagInfo>::const_iterator countIt = tagCounts.begin(),
                                                            countItEnd = tagCounts.end();
                countIt != countItEnd;
                ++countIt ) {
            std::ostringstream oss;
            oss << "  " << std::setw(2) << countIt->second.count << "  ";
            Text wrapper( countIt->second.all(), TextAttributes()
                                                    .setInitialIndent( 0 )
                                                    .setIndent( oss.str().size() )
                                                    .setWidth( CATCH_CONFIG_CONSOLE_WIDTH-10 ) );
            Catch::cout() << oss.str() << wrapper << "\n";
        }
        Catch::cout() << pluralise( tagCounts.size(), "tag" ) << "\n" << std::endl;
        return tagCounts.size();
    }